

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.h
# Opt level: O2

void __thiscall
cmTargetCompileFeaturesCommand::~cmTargetCompileFeaturesCommand
          (cmTargetCompileFeaturesCommand *this)

{
  cmTargetPropCommandBase::~cmTargetPropCommandBase(&this->super_cmTargetPropCommandBase);
  operator_delete(this,0x78);
  return;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmTargetCompileFeaturesCommand;
    }